

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

void Nf_ManCutMatchOne(Nf_Man_t *p,int iObj,int *pCut,int *pCutSet)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Nf_Obj_t *pNVar4;
  Vec_Int_t *pVVar5;
  Mio_Cell2_t *pMVar6;
  word wVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  uint *puVar22;
  long lVar23;
  Nf_Obj_t *pBestF [6];
  int local_b8;
  long alStack_68 [7];
  
  uVar1 = *pCut;
  if (p->vTt2Match->nSize <= (int)(uVar1 >> 6)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                  ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  uVar19 = uVar1 & 0x1f;
  local_b8 = (int)pCutSet;
  if (uVar19 == 0) {
    if (0x3f < uVar1) {
      __assert_fail("iFuncLit == 0 || iFuncLit == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                    ,0x461,"void Nf_ManCutMatchOne(Nf_Man_t *, int, int *, int *)");
    }
    uVar19 = ((int)pCut - local_b8 & 0xffcU) << 0x12;
    lVar16 = (long)iObj * 0x60;
    lVar21 = 0;
    do {
      uVar18 = (uint)lVar21 ^ (uint)(uVar1 >> 5 == 1);
      pNVar4 = p->pNfObjs;
      *(undefined8 *)((long)&pNVar4->M[0][1].D + lVar16) = 0;
      *(undefined8 *)((long)&pNVar4->M[0][0].D + lVar16) = 0;
      wVar7 = p->pCells[uVar18].Area;
      *(word *)((long)&pNVar4->M[0][1].A + lVar16) = wVar7;
      *(word *)((long)&pNVar4->M[0][0].A + lVar16) = wVar7;
      if (pCut <= pCutSet) goto LAB_006f6322;
      uVar9 = *(uint *)(&pNVar4->M[0][0].field_0x0 + lVar16);
      *(uint *)(&pNVar4->M[0][1].field_0x0 + lVar16) =
           *(uint *)(&pNVar4->M[0][1].field_0x0 + lVar16) & 0xc0000000 | uVar19 | uVar18;
      *(uint *)(&pNVar4->M[0][0].field_0x0 + lVar16) = uVar9 & 0xc0000000 | uVar19 | uVar18;
      *(undefined4 *)(&pNVar4->M[0][1].Cfg.field_0x0 + lVar16) = 0;
      *(undefined4 *)(&pNVar4->M[0][0].Cfg.field_0x0 + lVar16) = 0;
      lVar21 = lVar21 + 1;
      lVar16 = lVar16 + 0x30;
    } while (lVar21 == 1);
  }
  else {
    pNVar4 = p->pNfObjs;
    uVar18 = (uVar1 >> 6) << 4;
    pVVar5 = p->vTt2Match->pArray;
    uVar11 = 0;
    do {
      alStack_68[uVar11] = (long)(pNVar4 + pCut[uVar11 + 1]);
      uVar11 = uVar11 + 1;
    } while (uVar19 != uVar11);
    if (1 < *(int *)((long)&pVVar5->nSize + (ulong)uVar18)) {
      if (iObj < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10b,"int Abc_Var2Lit(int, int)");
      }
      uVar9 = ((int)pCut - local_b8 & 0xffcU) << 0x12;
      lVar16 = 0;
      do {
        lVar21 = *(long *)((long)&pVVar5->pArray + (ulong)uVar18);
        uVar2 = *(uint *)(lVar21 + 4 + lVar16 * 4);
        uVar10 = (uVar2 ^ uVar1 >> 5) & 1;
        uVar14 = uVar10 | iObj * 2;
        if ((p->vRequired).nSize <= (int)uVar14) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                        ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
        }
        iVar3 = *(int *)(lVar21 + lVar16 * 4);
        pMVar6 = p->pCells;
        if (uVar19 != *(uint *)&pMVar6[iVar3].field_0x10 >> 0x1c) {
          __assert_fail("nFans == (int)pC->nFanins",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                        ,0x479,"void Nf_ManCutMatchOne(Nf_Man_t *, int, int *, int *)");
        }
        uVar11 = (p->vRequired).pArray[uVar14];
        puVar22 = (uint *)(&pNVar4[iObj].M[0][0].field_0x0 + uVar10 * 0x30);
        uVar15 = pMVar6[iVar3].Area;
        bVar13 = 0;
        uVar17 = 0;
        uVar20 = 0;
        do {
          lVar21 = alStack_68[(uVar2 >> 8) >> (bVar13 & 0x1f) & 0xf];
          uVar10 = (uint)(((uVar2 >> 1 & 0x7f) >> ((uint)uVar17 & 0x1f) & 1) != 0);
          uVar12 = (ulong)(uVar10 * 0x30);
          wVar7 = pMVar6[iVar3].Delays[uVar17];
          lVar8 = *(long *)(lVar21 + 8 + uVar12);
          if (uVar11 == 0xffffffffffffffff) {
LAB_006f6136:
            if (((*(long *)(puVar22 + 2) != -1) && (*(long *)(puVar22 + 8) != -1)) &&
               (uVar11 < wVar7 + lVar8)) goto LAB_006f622e;
            uVar12 = wVar7 + lVar8;
            lVar23 = 0;
          }
          else {
            uVar12 = *(long *)(lVar21 + 0x20 + uVar12) + wVar7;
            lVar23 = 1;
            if (uVar11 < uVar12) goto LAB_006f6136;
          }
          if (uVar20 <= uVar12) {
            uVar20 = uVar12;
          }
          uVar15 = uVar15 + *(long *)(lVar21 + (ulong)(uVar10 * 0x30) + 0x10 + lVar23 * 0x18);
          uVar17 = uVar17 + 1;
          bVar13 = bVar13 + 4;
        } while (uVar19 != uVar17);
        if (uVar20 < *(ulong *)(puVar22 + 2)) {
          *(ulong *)(puVar22 + 2) = uVar20;
          *(ulong *)(puVar22 + 4) = uVar15;
          if (pCut <= pCutSet) {
LAB_006f6322:
            __assert_fail("pCut > pCutSet",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaNf.c"
                          ,0x95,"int Nf_CutHandle(int *, int *)");
          }
          uVar10 = *puVar22;
          *puVar22 = uVar10 & 0xc00fffff | uVar9;
          *puVar22 = uVar10 & 0xc0000000 | uVar9 | *(uint *)&pMVar6[iVar3].field_0x10 & 0xfffff;
          puVar22[1] = uVar2 & 0xfffffffe;
        }
        if (uVar15 < *(ulong *)(puVar22 + 10)) {
          *(ulong *)(puVar22 + 8) = uVar20;
          *(ulong *)(puVar22 + 10) = uVar15;
          if (pCut <= pCutSet) goto LAB_006f6322;
          uVar10 = puVar22[6];
          puVar22[6] = uVar10 & 0xc00fffff | uVar9;
          puVar22[6] = uVar10 & 0xc0000000 | uVar9 | *(uint *)&pMVar6[iVar3].field_0x10 & 0xfffff;
          puVar22[7] = uVar2 & 0xfffffffe;
        }
LAB_006f622e:
        lVar16 = lVar16 + 2;
      } while ((int)((uint)lVar16 | 1) < *(int *)((long)&pVVar5->nSize + (ulong)uVar18));
    }
  }
  return;
}

Assistant:

void Nf_ManCutMatchOne( Nf_Man_t * p, int iObj, int * pCut, int * pCutSet )
{
    Nf_Obj_t * pBest = Nf_ManObj(p, iObj);
    int * pFans      = Nf_CutLeaves(pCut);
    int nFans        = Nf_CutSize(pCut);
    int iFuncLit     = Nf_CutFunc(pCut);
    int fComplExt    = Abc_LitIsCompl(iFuncLit);
    Vec_Int_t * vArr = Vec_WecEntry( p->vTt2Match, Abc_Lit2Var(iFuncLit) );
    int i, k, c, Info, Offset, iFanin, fComplF;
    word ArrivalD, ArrivalA;
    Nf_Mat_t * pD, * pA;
    // assign fanins matches
    Nf_Obj_t * pBestF[NF_LEAF_MAX];
    for ( i = 0; i < nFans; i++ )
        pBestF[i] = Nf_ManObj( p, pFans[i] );
    // special cases
    if ( nFans == 0 )
    {
        int Const = (iFuncLit == 1);
        assert( iFuncLit == 0 || iFuncLit == 1 );
        for ( c = 0; c < 2; c++ )
        { 
            pD = Nf_ObjMatchD( p, iObj, c );
            pA = Nf_ObjMatchA( p, iObj, c );
            pD->D = pA->D = 0;
            pD->A = pA->A = p->pCells[c ^ Const].Area;
            pD->CutH = pA->CutH = Nf_CutHandle(pCutSet, pCut);
            pD->Gate = pA->Gate = c ^ Const;
//            pD->Conf = pA->Conf = 0;
            pD->Cfg = pA->Cfg = Nf_Int2Cfg(0);
        }
        return;
    }
    // consider matches of this function
    Vec_IntForEachEntryDouble( vArr, Info, Offset, i )
    {
        Nf_Cfg_t Cfg   = Nf_Int2Cfg(Offset);
        Mio_Cell2_t*pC = Nf_ManCell( p, Info );
        int fCompl     = Cfg.fCompl ^ fComplExt;
        word Required  = Nf_ObjRequired( p, iObj, fCompl );
        Nf_Mat_t * pD  = &pBest->M[fCompl][0];
        Nf_Mat_t * pA  = &pBest->M[fCompl][1];
        word Area      = pC->Area, Delay = 0;
        assert( nFans == (int)pC->nFanins );
        Nf_CfgForEachVarCompl( Cfg, nFans, iFanin, fComplF, k )
        {
            ArrivalD  = pBestF[iFanin]->M[fComplF][0].D;
            ArrivalA  = pBestF[iFanin]->M[fComplF][1].D;
            if ( ArrivalA + pC->Delays[k] <= Required && Required != NF_INFINITY )
            {
                Delay = Abc_MaxWord( Delay, ArrivalA + pC->Delays[k] );
                Area += pBestF[iFanin]->M[fComplF][1].A;
            }
            else 
            {
                if ( pD->D < NF_INFINITY && pA->D < NF_INFINITY && ArrivalD + pC->Delays[k] > Required )
                    break;
                Delay = Abc_MaxWord( Delay, ArrivalD + pC->Delays[k] );
                Area += pBestF[iFanin]->M[fComplF][0].A;
            }
        }
        if ( k < nFans )
            continue;
        // select best Cfgch
        if ( pD->D > Delay )
        {
            pD->D = Delay;
            pD->A = Area;
            pD->CutH = Nf_CutHandle(pCutSet, pCut);
            pD->Gate = pC->Id;
            pD->Cfg = Cfg;
            pD->Cfg.fCompl = 0;
        }

        if ( pA->A > Area )
        {
            pA->D = Delay;
            pA->A = Area;
            pA->CutH = Nf_CutHandle(pCutSet, pCut);
            pA->Gate = pC->Id;
            pA->Cfg = Cfg;
            pA->Cfg.fCompl = 0;
        }
    }
}